

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::_::RawSchema_*>::setCapacity(Vector<capnp::_::RawSchema_*> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::_::RawSchema_*> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::_::RawSchema_*> newBuilder;
  size_t newSize_local;
  Vector<capnp::_::RawSchema_*> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<capnp::_::RawSchema_*>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::_::RawSchema_*>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<capnp::_::RawSchema*>
            ((ArrayBuilder<capnp::_::RawSchema_*> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<capnp::_::RawSchema*>>(&this->builder);
  ArrayBuilder<capnp::_::RawSchema*>::addAll<kj::ArrayBuilder<capnp::_::RawSchema*>>
            ((ArrayBuilder<capnp::_::RawSchema*> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::_::RawSchema*>>
                     ((ArrayBuilder<capnp::_::RawSchema_*> *)local_38);
  ArrayBuilder<capnp::_::RawSchema_*>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::_::RawSchema_*>::~ArrayBuilder
            ((ArrayBuilder<capnp::_::RawSchema_*> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }